

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::MergeReturnPass::UpdatePhiNodes
          (MergeReturnPass *this,BasicBlock *new_source,BasicBlock *target)

{
  char cVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  MergeReturnPass **local_60;
  undefined8 local_58;
  code *local_50;
  code *local_48;
  Instruction *local_40;
  MergeReturnPass *local_38;
  BasicBlock *local_30;
  code *local_28;
  code *local_20;
  
  local_60 = &local_38;
  local_20 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:263:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:263:26)>
             ::_M_manager;
  local_58 = 0;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
             ::_M_manager;
  pIVar2 = (target->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_38 = this;
  local_30 = new_source;
  if ((pIVar2 != (Instruction *)0x0) &&
     ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar2 == (Instruction *)0x0) break;
      pIVar3 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar3 = (Instruction *)0x0;
      }
      if (pIVar2->opcode_ != OpPhi) break;
      local_40 = pIVar2;
      if (local_50 == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      cVar1 = (*local_48)(&local_60,&local_40);
      pIVar2 = pIVar3;
    } while (cVar1 != '\0');
    if (local_50 == (code *)0x0) goto LAB_0025b73b;
  }
  (*local_50)(&local_60,&local_60,3);
LAB_0025b73b:
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return;
}

Assistant:

void MergeReturnPass::UpdatePhiNodes(BasicBlock* new_source,
                                     BasicBlock* target) {
  target->ForEachPhiInst([this, new_source](Instruction* inst) {
    uint32_t undefId = Type2Undef(inst->type_id());
    inst->AddOperand({SPV_OPERAND_TYPE_ID, {undefId}});
    inst->AddOperand({SPV_OPERAND_TYPE_ID, {new_source->id()}});
    context()->UpdateDefUse(inst);
  });
}